

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int32_t iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  FieldDescriptorProto *pFVar6;
  OneofDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *proto_03;
  DescriptorProto_ReservedRange *pDVar7;
  MessageOptions *this_00;
  undefined8 *puVar8;
  int i;
  long lVar9;
  int i_6;
  long lVar10;
  int i_7;
  
  uVar3 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar4 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar3,puVar8);
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 4); lVar9 = lVar9 + 1) {
    lVar5 = *(long *)(this + 0x28);
    pFVar6 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->field_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar10),pFVar6);
    lVar10 = lVar10 + 0x48;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x68); lVar9 = lVar9 + 1) {
    lVar5 = *(long *)(this + 0x30);
    proto_00 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Add(&proto->oneof_decl_);
    OneofDescriptor::CopyTo((OneofDescriptor *)(lVar5 + lVar10),proto_00);
    lVar10 = lVar10 + 0x28;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x70); lVar9 = lVar9 + 1) {
    lVar5 = *(long *)(this + 0x38);
    proto_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&proto->nested_type_);
    CopyTo((Descriptor *)(lVar5 + lVar10),proto_01);
    lVar10 = lVar10 + 0x88;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x74); lVar9 = lVar9 + 1) {
    lVar5 = *(long *)(this + 0x40);
    proto_02 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&proto->enum_type_);
    EnumDescriptor::CopyTo((EnumDescriptor *)(lVar5 + lVar10),proto_02);
    lVar10 = lVar10 + 0x48;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x78); lVar9 = lVar9 + 1) {
    lVar5 = *(long *)(this + 0x48);
    proto_03 = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                         (&proto->extension_range_);
    ExtensionRange::CopyTo((ExtensionRange *)(lVar5 + lVar10),proto_03);
    lVar10 = lVar10 + 0x10;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x7c); lVar9 = lVar9 + 1) {
    lVar5 = *(long *)(this + 0x50);
    pFVar6 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->extension_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar10),pFVar6);
    lVar10 = lVar10 + 0x48;
  }
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x80); lVar9 = lVar9 + 1) {
    pDVar7 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add
                       (&proto->reserved_range_);
    lVar10 = *(long *)(this + 0x58);
    iVar1 = *(int32_t *)(lVar10 + lVar9 * 8);
    uVar2 = (pDVar7->_has_bits_).has_bits_[0];
    (pDVar7->_has_bits_).has_bits_[0] = uVar2 | 1;
    pDVar7->start_ = iVar1;
    iVar1 = *(int32_t *)(lVar10 + 4 + lVar9 * 8);
    (pDVar7->_has_bits_).has_bits_[0] = uVar2 | 3;
    pDVar7->end_ = iVar1;
  }
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x84); lVar9 = lVar9 + 1) {
    DescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0x60) + lVar9 * 8));
  }
  if (*(undefined1 **)(this + 0x20) != _MessageOptions_default_instance_) {
    this_00 = DescriptorProto::_internal_mutable_options(proto);
    MessageOptions::CopyFrom(this_00,*(MessageOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}